

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_iterator.h
# Opt level: O1

void __thiscall
cfd::core::IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper
          (IteratorWrapper<cfd::core::ScriptElement> *this,
          vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *vector,
          string *error_message,bool is_reverse)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  this->_vptr_IteratorWrapper = (_func_int **)&PTR__IteratorWrapper_007406f8;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&this->vector_,vector);
  uVar2 = *(undefined4 *)
           ((long)&(this->vector_).
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4);
  uVar3 = *(undefined4 *)
           &(this->vector_).
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = *(undefined4 *)
           ((long)&(this->vector_).
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 4);
  *(undefined4 *)&(this->iterator_)._M_current =
       *(undefined4 *)
        &(this->vector_).
         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)((long)&(this->iterator_)._M_current + 4) = uVar2;
  *(undefined4 *)&(this->reverse_iterator_).current._M_current = uVar3;
  *(undefined4 *)((long)&(this->reverse_iterator_).current._M_current + 4) = uVar4;
  (this->error_message_)._M_dataplus._M_p = (pointer)&(this->error_message_).field_2;
  pcVar1 = (error_message->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->error_message_,pcVar1,pcVar1 + error_message->_M_string_length);
  this->reverse_ = is_reverse;
  return;
}

Assistant:

IteratorWrapper(
      std::vector<T> vector, std::string error_message,
      bool is_reverse = false)
      : vector_(vector),
        iterator_(vector_.cbegin()),
        reverse_iterator_(vector_.crbegin()),
        error_message_(error_message),
        reverse_(is_reverse) {
    // do nothing
  }